

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  ostream *poVar1;
  Message MVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *__pattern;
  char *in_R9;
  AssertionResult gtest_ar_;
  Message local_68;
  AssertHelper local_60;
  string local_58;
  RE local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  pcVar4 = strdup(regex);
  *(char **)this = pcVar4;
  sVar5 = strlen(regex);
  pcVar4 = (char *)operator_new__(sVar5 + 10);
  snprintf(pcVar4,sVar5 + 10,"^(%s)$",regex);
  iVar3 = regcomp((regex_t *)(this + 0x10),pcVar4,1);
  this[8] = (RE)(iVar3 == 0);
  if (iVar3 == 0) {
    __pattern = "()";
    if (*regex != '\0') {
      __pattern = regex;
    }
    iVar3 = regcomp((regex_t *)(this + 0x50),__pattern,1);
    this[8] = (RE)(iVar3 == 0);
  }
  local_38[0] = this[8];
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38[0] == (RE)0x0) {
    Message::Message(&local_68);
    MVar2.ss_.ptr_ = local_68.ss_.ptr_;
    poVar1 = (ostream *)((long)local_68.ss_.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Regular expression \"",0x14);
    if (regex == (char *)0x0) {
      sVar5 = 6;
      regex = "(null)";
    }
    else {
      sVar5 = strlen(regex);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,regex,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"\" is not a valid POSIX Extended regular expression.",0x33);
    GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)local_38,(AssertionResult *)"is_valid_","false","true",in_R9);
    AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/googletest/src/gtest-port.cc"
               ,0xc0,local_58._M_dataplus._M_p);
    AssertHelper::operator=(&local_60,&local_68);
    AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (MVar2.ss_.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)MVar2.ss_.ptr_ + 8))(MVar2.ss_.ptr_);
      local_68.ss_.ptr_ =
           (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete__(pcVar4);
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = posix::StrDup(regex);

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}